

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubidi_props.cpp
# Opt level: O0

void ubidi_addPropertyStarts_63(USetAdder *sa,UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  UBool UVar2;
  uint8_t local_39;
  uint8_t jg;
  uint8_t *puStack_38;
  uint8_t prev;
  uint8_t *jgArray;
  int32_t local_28;
  UChar32 limit;
  UChar32 start;
  UChar32 c;
  int32_t length;
  int32_t i;
  UErrorCode *pErrorCode_local;
  USetAdder *sa_local;
  
  UVar2 = U_FAILURE(*pErrorCode);
  if (UVar2 == '\0') {
    utrie2_enum_63(&ubidi_props_singleton.trie,(UTrie2EnumValue *)0x0,_enumPropertyStartsRange,sa);
    for (c = 0; c < 0x28; c = c + 1) {
      (*(code *)sa->addRange)
                (sa->set,ubidi_props_mirrors[c] & 0x1fffff,(ubidi_props_mirrors[c] & 0x1fffff) + 1);
    }
    local_28 = 0x620;
    jgArray._4_4_ = 0x8c0;
    puStack_38 = "-";
    while( true ) {
      local_39 = '\0';
      for (; local_28 < jgArray._4_4_; local_28 = local_28 + 1) {
        uVar1 = *puStack_38;
        if (uVar1 != local_39) {
          (*(code *)sa->add)(sa->set,local_28);
          local_39 = uVar1;
        }
        puStack_38 = puStack_38 + 1;
      }
      if (local_39 != '\0') {
        (*(code *)sa->add)(sa->set,jgArray._4_4_);
      }
      if (jgArray._4_4_ != 0x8c0) break;
      local_28 = 0x10ac0;
      jgArray._4_4_ = 0x10d24;
      puStack_38 = ":<<@@=";
    }
  }
  return;
}

Assistant:

U_CFUNC void
ubidi_addPropertyStarts(const USetAdder *sa, UErrorCode *pErrorCode) {
    int32_t i, length;
    UChar32 c, start, limit;

    const uint8_t *jgArray;
    uint8_t prev, jg;

    if(U_FAILURE(*pErrorCode)) {
        return;
    }

    /* add the start code point of each same-value range of the trie */
    utrie2_enum(&ubidi_props_singleton.trie, NULL, _enumPropertyStartsRange, sa);

    /* add the code points from the bidi mirroring table */
    length=ubidi_props_singleton.indexes[UBIDI_IX_MIRROR_LENGTH];
    for(i=0; i<length; ++i) {
        c=UBIDI_GET_MIRROR_CODE_POINT(ubidi_props_singleton.mirrors[i]);
        sa->addRange(sa->set, c, c+1);
    }

    /* add the code points from the Joining_Group array where the value changes */
    start=ubidi_props_singleton.indexes[UBIDI_IX_JG_START];
    limit=ubidi_props_singleton.indexes[UBIDI_IX_JG_LIMIT];
    jgArray=ubidi_props_singleton.jgArray;
    for(;;) {
        prev=0;
        while(start<limit) {
            jg=*jgArray++;
            if(jg!=prev) {
                sa->add(sa->set, start);
                prev=jg;
            }
            ++start;
        }
        if(prev!=0) {
            /* add the limit code point if the last value was not 0 (it is now start==limit) */
            sa->add(sa->set, limit);
        }
        if(limit==ubidi_props_singleton.indexes[UBIDI_IX_JG_LIMIT]) {
            /* switch to the second Joining_Group range */
            start=ubidi_props_singleton.indexes[UBIDI_IX_JG_START2];
            limit=ubidi_props_singleton.indexes[UBIDI_IX_JG_LIMIT2];
            jgArray=ubidi_props_singleton.jgArray2;
        } else {
            break;
        }
    }

    /* add code points with hardcoded properties, plus the ones following them */

    /* (none right now) */
}